

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerStrictBrOrCm
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isBranch,
          bool isHelper)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  RegOpnd *pRVar6;
  IndirOpnd *pIVar7;
  IntConstOpnd *pIVar8;
  BranchInstr *pBVar9;
  Opnd *pOVar10;
  Opnd *pOVar11;
  LabelInstr *local_100;
  LabelInstr *local_f8;
  BranchInstr *branch_2;
  Opnd *src2Flags;
  IndirOpnd *src2Type;
  RegOpnd *src2TypeReg;
  Opnd *flags;
  IntConstOpnd *globalObjectTypeId;
  IntConstOpnd *hostDispatchTypeId;
  RegOpnd *src1TypeIdReg;
  RegOpnd *src1TypeReg;
  BranchInstr *branch;
  BranchInstr *branch_1;
  Opnd *local_70;
  Opnd *src2;
  Opnd *src1;
  LibraryValue local_58;
  LibraryValue LStack_54;
  bool isEqual;
  LibraryValue failureValueType;
  LibraryValue successValueType;
  LabelInstr *labelBranchFailure;
  LabelInstr *labelBranchSuccess;
  LabelInstr *labelFallThrough;
  LabelInstr *labelHelper;
  Instr *instrPrev;
  bool isHelper_local;
  bool isBranch_local;
  bool noMathFastPath_local;
  Instr *pIStack_20;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  labelHelper = (LabelInstr *)instr->m_prev;
  labelFallThrough = (LabelInstr *)0x0;
  labelBranchSuccess = (LabelInstr *)0x0;
  labelBranchFailure = (LabelInstr *)0x0;
  _failureValueType = (LabelInstr *)0x0;
  LStack_54 = ValueInvalid;
  local_58 = ValueInvalid;
  instrPrev._1_1_ = isHelper;
  instrPrev._2_1_ = isBranch;
  instrPrev._3_1_ = noMathFastPath;
  instrPrev._4_4_ = helperMethod;
  pIStack_20 = instr;
  instr_local = (Instr *)this;
  bVar2 = IR::Instr::IsNeq(instr);
  src1._7_1_ = (bVar2 ^ 0xffU) & 1;
  src2 = IR::Instr::GetSrc1(pIStack_20);
  local_70 = IR::Instr::GetSrc2(pIStack_20);
  if ((src2 == (Opnd *)0x0) || (local_70 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2947,"(src1 != nullptr && src2 != nullptr)","Expected 2 src opnds on BrC")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  labelFallThrough = IR::LabelInstr::New(Label,this->m_func,true);
  if ((instrPrev._3_1_ & 1) == 0) {
    local_f8 = IR::Instr::GetOrCreateContinueLabel(pIStack_20,(bool)(instrPrev._1_1_ & 1));
    labelBranchSuccess = local_f8;
    if ((instrPrev._2_1_ & 1) == 0) {
      labelBranchFailure = IR::LabelInstr::New(Label,this->m_func,(bool)(instrPrev._1_1_ & 1));
      _failureValueType = IR::LabelInstr::New(Label,this->m_func,(bool)(instrPrev._1_1_ & 1));
      LStack_54 = ValueFalse;
      if ((src1._7_1_ & 1) != 0) {
        LStack_54 = ValueTrue;
      }
      local_58 = ValueTrue;
      if ((src1._7_1_ & 1) != 0) {
        local_58 = ValueFalse;
      }
    }
    else {
      if ((src1._7_1_ & 1) != 0) {
        pBVar9 = IR::Instr::AsBranchInstr(pIStack_20);
        local_f8 = IR::BranchInstr::GetTarget(pBVar9);
      }
      labelBranchFailure = local_f8;
      if ((src1._7_1_ & 1) == 0) {
        pBVar9 = IR::Instr::AsBranchInstr(pIStack_20);
        local_100 = IR::BranchInstr::GetTarget(pBVar9);
      }
      else {
        local_100 = labelBranchSuccess;
      }
      _failureValueType = local_100;
    }
    bVar2 = IR::Opnd::IsEqual(src2,local_70);
    if (bVar2) {
      pOVar10 = IR::Instr::GetSrc1(pIStack_20);
      branch_1._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(pOVar10);
      bVar2 = ValueType::IsNotFloat((ValueType *)((long)&branch_1 + 6));
      if (bVar2) {
        if ((instrPrev._2_1_ & 1) == 0) {
          pOVar10 = IR::Instr::GetDst(pIStack_20);
          pOVar11 = LoadLibraryValueOpnd(this,pIStack_20,LStack_54);
          InsertMove(pOVar10,pOVar11,pIStack_20,true);
          InsertBranch(Br,labelBranchSuccess,pIStack_20);
        }
        else {
          pBVar9 = IR::BranchInstr::New(JMP,labelBranchFailure,this->m_func);
          IR::Instr::InsertBefore(pIStack_20,&pBVar9->super_Instr);
        }
        IR::Instr::Remove(pIStack_20);
        return &labelHelper->super_Instr;
      }
      pRVar5 = IR::Opnd::AsRegOpnd(src2);
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar5->super_Opnd,pIStack_20,labelFallThrough,false);
      pBVar9 = IR::BranchInstr::New(JMP,labelBranchFailure,this->m_func);
      IR::Instr::InsertBefore(pIStack_20,&pBVar9->super_Instr);
    }
    else {
      pRVar5 = IR::Opnd::AsRegOpnd(src2);
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar5->super_Opnd,pIStack_20,labelFallThrough,false);
      InsertCompareBranch(this,src2,local_70,BrEq_A,labelBranchFailure,pIStack_20,false);
      pRVar5 = IR::RegOpnd::New(TyInt64,this->m_func);
      pRVar6 = IR::Opnd::AsRegOpnd(src2);
      uVar3 = Js::RecyclableObject::GetOffsetOfType();
      pIVar7 = IR::IndirOpnd::New(pRVar6,uVar3,TyInt64,this->m_func,false);
      InsertMove(&pRVar5->super_Opnd,&pIVar7->super_Opnd,pIStack_20,true);
      pRVar6 = IR::RegOpnd::New(TyInt32,this->m_func);
      uVar3 = Js::Type::GetOffsetOfTypeId();
      pIVar7 = IR::IndirOpnd::New(pRVar5,uVar3,TyInt32,this->m_func,false);
      InsertMove(&pRVar6->super_Opnd,&pIVar7->super_Opnd,pIStack_20,true);
      pIVar8 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,true);
      InsertCompareBranch(this,&pRVar6->super_Opnd,&pIVar8->super_Opnd,BrLe_A,labelFallThrough,
                          pIStack_20,false);
      pIVar8 = IR::IntConstOpnd::New(0x50,TyInt32,this->m_func,true);
      InsertCompareBranch(this,&pRVar6->super_Opnd,&pIVar8->super_Opnd,BrEq_A,labelFallThrough,
                          pIStack_20,false);
      uVar3 = Js::Type::GetOffsetOfFlags();
      pIVar7 = IR::IndirOpnd::New(pRVar5,uVar3,TyInt8,this->m_func,false);
      pIVar8 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
      InsertTestBranch(&pIVar7->super_Opnd,&pIVar8->super_Opnd,BrNeq_A,labelFallThrough,pIStack_20);
      bVar2 = IR::Opnd::IsRegOpnd(local_70);
      if (bVar2) {
        pRVar5 = IR::Opnd::AsRegOpnd(local_70);
        LowererMD::GenerateObjectTest
                  (&this->m_lowererMD,&pRVar5->super_Opnd,pIStack_20,labelFallThrough,false);
        pRVar5 = IR::RegOpnd::New(TyInt64,this->m_func);
        pRVar6 = IR::Opnd::AsRegOpnd(local_70);
        uVar3 = Js::RecyclableObject::GetOffsetOfType();
        pIVar7 = IR::IndirOpnd::New(pRVar6,uVar3,TyInt64,this->m_func,false);
        InsertMove(&pRVar5->super_Opnd,&pIVar7->super_Opnd,pIStack_20,true);
        uVar3 = Js::Type::GetOffsetOfFlags();
        pIVar7 = IR::IndirOpnd::New(pRVar5,uVar3,TyInt8,this->m_func,false);
        pIVar8 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
        InsertTestBranch(&pIVar7->super_Opnd,&pIVar8->super_Opnd,BrNeq_A,labelFallThrough,pIStack_20
                        );
      }
      pBVar9 = IR::BranchInstr::New(JMP,_failureValueType,this->m_func);
      IR::Instr::InsertBefore(pIStack_20,&pBVar9->super_Instr);
    }
    if ((instrPrev._2_1_ & 1) == 0) {
      IR::Instr::InsertBefore(pIStack_20,&labelBranchFailure->super_Instr);
      pOVar10 = IR::Instr::GetDst(pIStack_20);
      pOVar11 = LoadLibraryValueOpnd(this,pIStack_20,LStack_54);
      InsertMove(pOVar10,pOVar11,pIStack_20,true);
      InsertBranch(Br,labelBranchSuccess,pIStack_20);
      IR::Instr::InsertBefore(pIStack_20,&_failureValueType->super_Instr);
      pOVar10 = IR::Instr::GetDst(pIStack_20);
      pOVar11 = LoadLibraryValueOpnd(this,pIStack_20,local_58);
      InsertMove(pOVar10,pOVar11,pIStack_20,true);
      InsertBranch(Br,labelBranchSuccess,pIStack_20);
    }
  }
  IR::Instr::InsertBefore(pIStack_20,&labelFallThrough->super_Instr);
  if ((instrPrev._2_1_ & 1) == 0) {
    LowerBinaryHelperMem(this,pIStack_20,instrPrev._4_4_);
  }
  else {
    LowerBrCMem(this,pIStack_20,instrPrev._4_4_,true,true);
  }
  return &labelHelper->super_Instr;
}

Assistant:

IR::Instr *
Lowerer::LowerStrictBrOrCm(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isBranch, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::LabelInstr * labelHelper = nullptr;
    IR::LabelInstr * labelFallThrough = nullptr;
    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    bool isEqual = !instr->IsNeq();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    AssertMsg(src1 != nullptr && src2 != nullptr, "Expected 2 src opnds on BrC");

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!noMathFastPath)
    {
        labelFallThrough = instr->GetOrCreateContinueLabel(isHelper);

        if (!isBranch)
        {
            labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
            failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
        }
        else
        {
            labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
            labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
        }

        if (src1->IsEqual(src2))
        {
            if (instr->GetSrc1()->GetValueType().IsNotFloat())
            {
                if (!isBranch)
                {
                    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
                    InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
                }
                else
                {
                    IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
                    instr->InsertBefore(branch);
                }
                instr->Remove();
                return instrPrev;
            }
#if !FLOATVAR
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#else
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
#endif
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
            instr->InsertBefore(branch);
        }
        else
        {
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);

#if !FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#endif
            //      CMP src1, src2                       - Ptr comparison
            //      JEQ $branchSuccess
            InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

#if FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);
#endif
            // CMP src1TypeIdReg, TypeIds_HostDispatch
            // JLE $helper (le condition covers string, int64, uint64, hostdispatch, as well as undefined, null, boolean)
            IR::IntConstOpnd *hostDispatchTypeId = IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, hostDispatchTypeId, Js::OpCode::BrLe_A, labelHelper, instr);

            // CMP src1TypeIdReg, TypeIds_GlobalObject
            // JE $helper
            IR::IntConstOpnd *globalObjectTypeId = IR::IntConstOpnd::New(Js::TypeIds_GlobalObject, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, globalObjectTypeId, Js::OpCode::BrEq_A, labelHelper, instr);

            // TEST src1TypeReg->flags, TypeFlagMask_EngineExternal
            // JE $helper

            IR::Opnd *flags = IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);

            if (src2->IsRegOpnd())
            {
                m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper);
                // MOV src2TypeReg, [src2 + offset(type)]
                // TEST [src2TypeReg + offset(flags)], TypeFlagMask_EngineExternal
                // JE $helper
                IR::RegOpnd *src2TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
                IR::IndirOpnd *src2Type = IR::IndirOpnd::New(src2->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
                Lowerer::InsertMove(src2TypeReg, src2Type, instr);
                IR::Opnd *src2Flags = IR::IndirOpnd::New(src2TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
                InsertTestBranch(src2Flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
            }

            // JMP $done
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
            instr->InsertBefore(branch);
        }

        if (!isBranch)
        {
            instr->InsertBefore(labelBranchSuccess);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

            instr->InsertBefore(labelBranchFailure);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
        }
    }

    instr->InsertBefore(labelHelper);

    if (isBranch)
    {
        LowerBrCMem(instr, helperMethod, true, true);
    }
    else
    {
        LowerBinaryHelperMem(instr, helperMethod);
    }

    return instrPrev;
}